

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

uint32_t google::protobuf::internal::anon_unknown_0::RecodeTagForFastParsing(uint32_t tag)

{
  uint32_t uVar1;
  string *psVar2;
  
  if (tag < 0x4000) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)tag,0x3fff,"tag <= 0x3FFFu");
  }
  if (psVar2 == (string *)0x0) {
    uVar1 = tag + 0x80 + (tag & 0xffffff80);
    if ((tag & 0xffffff80) == 0) {
      uVar1 = tag;
    }
    return uVar1;
  }
  _GLOBAL__N_1::RecodeTagForFastParsing();
}

Assistant:

uint32_t RecodeTagForFastParsing(uint32_t tag) {
  ABSL_DCHECK_LE(tag, 0x3FFFu);
  // Construct the varint-coded tag. If it is more than 7 bits, we need to
  // shift the high bits and add a continue bit.
  if (uint32_t hibits = tag & 0xFFFFFF80) {
    // hi = tag & ~0x7F
    // lo = tag & 0x7F
    // This shifts hi to the left by 1 to the next byte and sets the
    // continuation bit.
    tag = tag + hibits + 128;
  }
  return tag;
}